

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__jpeg_decode_block
              (stbi__jpeg *j,short *data,stbi__huffman *hdc,stbi__huffman *hac,stbi__int16 *fac,
              int b,stbi__uint16 *dequant)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  short sVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  if (j->code_bits < 0x10) {
    stbi__grow_buffer_unsafe(j);
  }
  uVar14 = j->code_buffer;
  uVar5 = (ulong)hdc->fast[uVar14 >> 0x17];
  if (uVar5 == 0xff) {
    lVar10 = 0;
    do {
      lVar11 = lVar10;
      lVar10 = lVar11 + 1;
    } while (hdc->maxcode[lVar11 + 10] <= uVar14 >> 0x10);
    iVar7 = j->code_bits;
    if (lVar10 == 8) {
      j->code_bits = iVar7 + -0x10;
      uVar8 = 0xffffffff;
    }
    else {
      uVar8 = 0xffffffff;
      if ((int)(lVar11 + 10) <= iVar7) {
        iVar12 = (uVar14 >> (0x17U - (char)lVar10 & 0x1f) & stbi__bmask[lVar11 + 10]) +
                 hdc->delta[lVar11 + 10];
        if ((uVar14 >> (-hdc->size[iVar12] & 0x1f) & stbi__bmask[hdc->size[iVar12]]) !=
            (uint)hdc->code[iVar12]) {
LAB_0011251c:
          __assert_fail("(((j->code_buffer) >> (32 - h->size[c])) & stbi__bmask[h->size[c]]) == h->code[c]"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image.h"
                        ,0x8b5,"int stbi__jpeg_huff_decode(stbi__jpeg *, stbi__huffman *)");
        }
        j->code_bits = (iVar7 - (int)lVar10) + -9;
        j->code_buffer = uVar14 << ((byte)(lVar11 + 10) & 0x1f);
        uVar8 = (uint)hdc->values[iVar12];
      }
    }
  }
  else {
    bVar1 = hdc->size[uVar5];
    uVar8 = 0xffffffff;
    if ((int)(uint)bVar1 <= j->code_bits) {
      j->code_buffer = uVar14 << (bVar1 & 0x1f);
      j->code_bits = j->code_bits - (uint)bVar1;
      uVar8 = (uint)hdc->values[uVar5];
    }
  }
  if ((int)uVar8 < 0) {
    stbi__g_failure_reason = "bad huffman code";
LAB_001124ec:
    iVar12 = 0;
  }
  else {
    data[0x38] = 0;
    data[0x39] = 0;
    data[0x3a] = 0;
    data[0x3b] = 0;
    data[0x3c] = 0;
    data[0x3d] = 0;
    data[0x3e] = 0;
    data[0x3f] = 0;
    data[0x30] = 0;
    data[0x31] = 0;
    data[0x32] = 0;
    data[0x33] = 0;
    data[0x34] = 0;
    data[0x35] = 0;
    data[0x36] = 0;
    data[0x37] = 0;
    data[0x28] = 0;
    data[0x29] = 0;
    data[0x2a] = 0;
    data[0x2b] = 0;
    data[0x2c] = 0;
    data[0x2d] = 0;
    data[0x2e] = 0;
    data[0x2f] = 0;
    data[0x20] = 0;
    data[0x21] = 0;
    data[0x22] = 0;
    data[0x23] = 0;
    data[0x24] = 0;
    data[0x25] = 0;
    data[0x26] = 0;
    data[0x27] = 0;
    data[0x18] = 0;
    data[0x19] = 0;
    data[0x1a] = 0;
    data[0x1b] = 0;
    data[0x1c] = 0;
    data[0x1d] = 0;
    data[0x1e] = 0;
    data[0x1f] = 0;
    data[0x10] = 0;
    data[0x11] = 0;
    data[0x12] = 0;
    data[0x13] = 0;
    data[0x14] = 0;
    data[0x15] = 0;
    data[0x16] = 0;
    data[0x17] = 0;
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[0xc] = 0;
    data[0xd] = 0;
    data[0xe] = 0;
    data[0xf] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    if (uVar8 == 0) {
      iVar7 = 0;
    }
    else {
      if (j->code_bits < (int)uVar8) {
        stbi__grow_buffer_unsafe(j);
      }
      if (0x10 < uVar8) {
        __assert_fail("n >= 0 && n < (int) (sizeof(stbi__bmask) / sizeof(*stbi__bmask))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dmarcinkovic[P]NeuralNetwork/imageLoader/stb_image.h"
                      ,0x8cb,"int stbi__extend_receive(stbi__jpeg *, int)");
      }
      uVar14 = j->code_buffer;
      bVar1 = (byte)uVar8 & 0x1f;
      uVar4 = uVar14 << bVar1 | uVar14 >> 0x20 - bVar1;
      uVar3 = stbi__bmask[uVar8];
      j->code_buffer = ~uVar3 & uVar4;
      j->code_bits = j->code_bits - uVar8;
      iVar7 = 0;
      if (-1 < (int)uVar14) {
        iVar7 = stbi__jbias[uVar8];
      }
      iVar7 = iVar7 + (uVar4 & uVar3);
    }
    iVar7 = iVar7 + j->img_comp[b].dc_pred;
    j->img_comp[b].dc_pred = iVar7;
    *data = (short)iVar7 * *dequant;
    iVar7 = 1;
    do {
      if (j->code_bits < 0x10) {
        stbi__grow_buffer_unsafe(j);
      }
      uVar2 = fac[j->code_buffer >> 0x17];
      if (uVar2 == 0) {
        if (j->code_bits < 0x10) {
          stbi__grow_buffer_unsafe(j);
        }
        uVar14 = j->code_buffer;
        uVar5 = (ulong)hac->fast[uVar14 >> 0x17];
        if (uVar5 == 0xff) {
          lVar10 = 0;
          do {
            lVar11 = lVar10;
            lVar10 = lVar11 + 1;
          } while (hac->maxcode[lVar11 + 10] <= uVar14 >> 0x10);
          iVar12 = j->code_bits;
          if (lVar10 == 8) {
            j->code_bits = iVar12 + -0x10;
            uVar8 = 0xffffffff;
          }
          else {
            uVar8 = 0xffffffff;
            if ((int)(lVar11 + 10) <= iVar12) {
              iVar13 = (uVar14 >> (0x17U - (char)lVar10 & 0x1f) & stbi__bmask[lVar11 + 10]) +
                       hac->delta[lVar11 + 10];
              if ((uVar14 >> (-hac->size[iVar13] & 0x1f) & stbi__bmask[hac->size[iVar13]]) !=
                  (uint)hac->code[iVar13]) goto LAB_0011251c;
              j->code_bits = (iVar12 - (int)lVar10) + -9;
              j->code_buffer = uVar14 << ((byte)(lVar11 + 10) & 0x1f);
              uVar8 = (uint)hac->values[iVar13];
            }
          }
        }
        else {
          bVar1 = hac->size[uVar5];
          uVar8 = 0xffffffff;
          if ((int)(uint)bVar1 <= j->code_bits) {
            j->code_buffer = uVar14 << (bVar1 & 0x1f);
            j->code_bits = j->code_bits - (uint)bVar1;
            uVar8 = (uint)hac->values[uVar5];
          }
        }
        if ((int)uVar8 < 0) {
          stbi__g_failure_reason = "bad huffman code";
          cVar6 = '\x01';
        }
        else {
          uVar14 = uVar8 & 0xf;
          if (uVar14 == 0) {
            iVar12 = iVar7 + 0x10;
            if (uVar8 != 0xf0) {
              iVar12 = iVar7;
            }
            iVar7 = iVar12;
            cVar6 = (uVar8 != 0xf0) * '\x02';
          }
          else {
            lVar10 = (long)iVar7 + (ulong)(uVar8 >> 4);
            bVar1 = ""[lVar10];
            if (j->code_bits < (int)uVar14) {
              stbi__grow_buffer_unsafe(j);
            }
            uVar8 = j->code_buffer;
            uVar4 = uVar8 << (sbyte)uVar14 | uVar8 >> 0x20 - (sbyte)uVar14;
            uVar3 = *(uint *)((long)stbi__bmask + (ulong)(uVar14 * 4));
            j->code_buffer = ~uVar3 & uVar4;
            j->code_bits = j->code_bits - uVar14;
            cVar6 = '\0';
            sVar9 = 0;
            if (-1 < (int)uVar8) {
              sVar9 = (short)*(undefined4 *)((long)stbi__jbias + (ulong)(uVar14 * 4));
            }
            iVar7 = (int)lVar10 + 1;
            *(ushort *)((long)data + (ulong)((uint)bVar1 * 2)) =
                 (((ushort)uVar4 & (ushort)uVar3) + sVar9) *
                 *(short *)((long)dequant + (ulong)((uint)bVar1 * 2));
          }
        }
      }
      else {
        lVar10 = (long)iVar7 + (ulong)(uVar2 >> 4 & 0xf);
        j->code_buffer = j->code_buffer << (sbyte)(uVar2 & 0xf);
        j->code_bits = j->code_bits - (uVar2 & 0xf);
        iVar7 = (int)lVar10 + 1;
        *(short *)((long)data + (ulong)((uint)""[lVar10] * 2)) =
             (short)(char)(uVar2 >> 8) * *(short *)((long)dequant + (ulong)((uint)""[lVar10] * 2));
        cVar6 = '\0';
      }
      iVar12 = 1;
      if (cVar6 != '\0') {
        if (cVar6 == '\x02') {
          return 1;
        }
        goto LAB_001124ec;
      }
    } while (iVar7 < 0x40);
  }
  return iVar12;
}

Assistant:

static int
stbi__jpeg_decode_block(stbi__jpeg *j, short data[64], stbi__huffman *hdc, stbi__huffman *hac, stbi__int16 *fac, int b,
                        stbi__uint16 *dequant)
{
    int diff, dc, k;
    int t;

    if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
    t = stbi__jpeg_huff_decode(j, hdc);
    if (t < 0) return stbi__err("bad huffman code", "Corrupt JPEG");

    // 0 all the ac values now so we can do it 32-bits at a time
    memset(data, 0, 64 * sizeof(data[0]));

    diff = t ? stbi__extend_receive(j, t) : 0;
    dc = j->img_comp[b].dc_pred + diff;
    j->img_comp[b].dc_pred = dc;
    data[0] = (short) (dc * dequant[0]);

    // decode AC components, see JPEG spec
    k = 1;
    do
    {
        unsigned int zig;
        int c, r, s;
        if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
        c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS) - 1);
        r = fac[c];
        if (r)
        { // fast-AC path
            k += (r >> 4) & 15; // run
            s = r & 15; // combined length
            j->code_buffer <<= s;
            j->code_bits -= s;
            // decode into unzigzag'd location
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) ((r >> 8) * dequant[zig]);
        } else
        {
            int rs = stbi__jpeg_huff_decode(j, hac);
            if (rs < 0) return stbi__err("bad huffman code", "Corrupt JPEG");
            s = rs & 15;
            r = rs >> 4;
            if (s == 0)
            {
                if (rs != 0xf0) break; // end block
                k += 16;
            } else
            {
                k += r;
                // decode into unzigzag'd location
                zig = stbi__jpeg_dezigzag[k++];
                data[zig] = (short) (stbi__extend_receive(j, s) * dequant[zig]);
            }
        }
    } while (k < 64);
    return 1;
}